

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapOneofField<true>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t key;
  CppType CVar2;
  uint32_t uVar3;
  int32_t v;
  int v_00;
  LogMessage *pLVar4;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  Message *v_01;
  uint64_t v_02;
  int64_t v_03;
  ArenaStringPtr v_04;
  uint32_t *puVar5;
  float fVar6;
  double v_05;
  LogFinisher local_d9;
  MessageWrapper local_d8;
  MessageWrapper local_c0;
  uint32_t local_a4;
  Message *local_a0;
  LocalVarWrapper temp;
  LogMessage local_70;
  LogMessage *local_38;
  
  local_a0 = rhs;
  if ((*(int *)(oneof_descriptor + 4) == 1) &&
     ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x36f);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_70,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&temp,pLVar4);
    internal::LogMessage::~LogMessage(&local_70);
  }
  key = GetOneofCase(this,lhs,oneof_descriptor);
  local_a4 = GetOneofCase(this,local_a0,oneof_descriptor);
  temp.string_val._M_dataplus._M_p = (pointer)&temp.string_val.field_2;
  temp.string_val._M_string_length = 0;
  temp.string_val.field_2._M_local_buf[0] = '\0';
  if (key == 0) {
    this_00 = (FieldDescriptor *)0x0;
    goto LAB_00399d7f;
  }
  this_00 = Descriptor::FindFieldByNumber(this->descriptor_,key);
  local_c0.reflection = this;
  local_c0.message = lhs;
  local_c0.field = this_00;
  CVar2 = FieldDescriptor::cpp_type(this_00);
  switch(CVar2) {
  case CPPTYPE_INT32:
    uVar3 = SwapOneofField<true>::MessageWrapper::GetInt32(&local_c0);
    goto LAB_00399cd4;
  case CPPTYPE_INT64:
    temp.oneof_val.type_int64 = SwapOneofField<true>::MessageWrapper::GetInt64(&local_c0);
    break;
  case CPPTYPE_UINT32:
    uVar3 = SwapOneofField<true>::MessageWrapper::GetUint32(&local_c0);
    goto LAB_00399cd4;
  case CPPTYPE_UINT64:
    temp.oneof_val.type_uint64 = SwapOneofField<true>::MessageWrapper::GetUint64(&local_c0);
    break;
  case CPPTYPE_DOUBLE:
    temp.oneof_val.type_double = SwapOneofField<true>::MessageWrapper::GetDouble(&local_c0);
    break;
  case CPPTYPE_FLOAT:
    fVar6 = SwapOneofField<true>::MessageWrapper::GetFloat(&local_c0);
    temp.oneof_val.type_float = fVar6;
    break;
  case CPPTYPE_BOOL:
    bVar1 = SwapOneofField<true>::MessageWrapper::GetBool(&local_c0);
    temp.oneof_val.type_bool = bVar1;
    break;
  case CPPTYPE_ENUM:
    uVar3 = SwapOneofField<true>::MessageWrapper::GetEnum(&local_c0);
LAB_00399cd4:
    temp.oneof_val.type_enum = uVar3;
    break;
  case CPPTYPE_STRING:
    temp.oneof_val.type_arena_string_ptr =
         SwapOneofField<true>::MessageWrapper::GetArenaStringPtr(&local_c0);
    break;
  case CPPTYPE_MESSAGE:
    temp.oneof_val.type_message = SwapOneofField<true>::MessageWrapper::UnsafeGetMessage(&local_c0);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x1bf);
    pLVar4 = internal::LogMessage::operator<<(&local_70,"unimplemented type: ");
    CVar2 = FieldDescriptor::cpp_type(this_00);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,CVar2);
    internal::LogFinisher::operator=(&local_d9,pLVar4);
    internal::LogMessage::~LogMessage(&local_70);
  }
  SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_c0);
LAB_00399d7f:
  if (local_a4 != 0) {
    this_01 = Descriptor::FindFieldByNumber(this->descriptor_,local_a4);
    local_d8.message = local_a0;
    local_d8.reflection = this;
    local_d8.field = this_01;
    local_c0.reflection = this;
    local_c0.message = lhs;
    local_c0.field = this_01;
    CVar2 = FieldDescriptor::cpp_type(this_01);
    switch(CVar2) {
    case CPPTYPE_INT32:
      v = SwapOneofField<true>::MessageWrapper::GetInt32(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetInt32(&local_c0,v);
      break;
    case CPPTYPE_INT64:
      v_03 = SwapOneofField<true>::MessageWrapper::GetInt64(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetInt64(&local_c0,v_03);
      break;
    case CPPTYPE_UINT32:
      uVar3 = SwapOneofField<true>::MessageWrapper::GetUint32(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetUint32(&local_c0,uVar3);
      break;
    case CPPTYPE_UINT64:
      v_02 = SwapOneofField<true>::MessageWrapper::GetUint64(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetUint64(&local_c0,v_02);
      break;
    case CPPTYPE_DOUBLE:
      v_05 = SwapOneofField<true>::MessageWrapper::GetDouble(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetDouble(&local_c0,v_05);
      break;
    case CPPTYPE_FLOAT:
      fVar6 = SwapOneofField<true>::MessageWrapper::GetFloat(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetFloat(&local_c0,fVar6);
      break;
    case CPPTYPE_BOOL:
      bVar1 = SwapOneofField<true>::MessageWrapper::GetBool(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetBool(&local_c0,bVar1);
      break;
    case CPPTYPE_ENUM:
      v_00 = SwapOneofField<true>::MessageWrapper::GetEnum(&local_d8);
      SwapOneofField<true>::MessageWrapper::SetEnum(&local_c0,v_00);
      break;
    case CPPTYPE_STRING:
      v_04 = SwapOneofField<true>::MessageWrapper::GetArenaStringPtr(&local_d8);
      SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::ArenaStringPtr_(&local_c0,v_04);
      break;
    case CPPTYPE_MESSAGE:
      v_01 = SwapOneofField<true>::MessageWrapper::UnsafeGetMessage(&local_d8);
      SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_c0,v_01);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      local_38 = internal::LogMessage::operator<<(&local_70,"unimplemented type: ");
      CVar2 = FieldDescriptor::cpp_type(this_01);
      pLVar4 = internal::LogMessage::operator<<(local_38,CVar2);
      internal::LogFinisher::operator=(&local_d9,pLVar4);
      internal::LogMessage::~LogMessage(&local_70);
    }
    SwapOneofField<true>::MessageWrapper::ClearOneofCase(&local_d8);
  }
  if (key != 0) {
    local_d8.message = local_a0;
    local_d8.reflection = this;
    local_d8.field = this_00;
    CVar2 = FieldDescriptor::cpp_type(this_00);
    switch(CVar2) {
    case CPPTYPE_INT32:
      SwapOneofField<true>::MessageWrapper::SetInt32(&local_d8,temp.oneof_val.type_int32);
      break;
    case CPPTYPE_INT64:
      SwapOneofField<true>::MessageWrapper::SetInt64(&local_d8,temp.oneof_val.type_int64);
      break;
    case CPPTYPE_UINT32:
      SwapOneofField<true>::MessageWrapper::SetUint32(&local_d8,temp.oneof_val.type_uint32);
      break;
    case CPPTYPE_UINT64:
      SwapOneofField<true>::MessageWrapper::SetUint64(&local_d8,temp.oneof_val.type_uint64);
      break;
    case CPPTYPE_DOUBLE:
      SwapOneofField<true>::MessageWrapper::SetDouble(&local_d8,temp.oneof_val.type_double);
      break;
    case CPPTYPE_FLOAT:
      SwapOneofField<true>::MessageWrapper::SetFloat(&local_d8,temp.oneof_val.type_float);
      break;
    case CPPTYPE_BOOL:
      SwapOneofField<true>::MessageWrapper::SetBool(&local_d8,temp.oneof_val.type_bool);
      break;
    case CPPTYPE_ENUM:
      SwapOneofField<true>::MessageWrapper::SetEnum(&local_d8,temp.oneof_val.type_enum);
      break;
    case CPPTYPE_STRING:
      SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::ArenaStringPtr_(&local_d8,temp.oneof_val.type_arena_string_ptr.tagged_ptr_.ptr_);
      break;
    case CPPTYPE_MESSAGE:
      SwapOneofField<true>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_d8,temp.oneof_val.type_message);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar4 = internal::LogMessage::operator<<(&local_70,"unimplemented type: ");
      CVar2 = FieldDescriptor::cpp_type(this_00);
      pLVar4 = internal::LogMessage::operator<<(pLVar4,CVar2);
      internal::LogFinisher::operator=(&local_d9,pLVar4);
      internal::LogMessage::~LogMessage(&local_70);
    }
  }
  puVar5 = MutableOneofCase(this,lhs,oneof_descriptor);
  *puVar5 = local_a4;
  puVar5 = MutableOneofCase(this,local_a0,oneof_descriptor);
  *puVar5 = key;
  std::__cxx11::string::~string((string *)&temp.string_val);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32 oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}